

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O2

uint8_t __thiscall m6502::BIT(m6502 *this)

{
  byte bVar1;
  
  fetch(this);
  bVar1 = this->a & this->fetched;
  this->status = this->fetched & 0x40 | this->status & 0x3d | bVar1 & 0x80 | (bVar1 == 0) * '\x02';
  return '\0';
}

Assistant:

uint8_t BIT()
  {
    fetch();
    uint16_t tmp = a & fetched;
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    SetFlag(V, fetched & (1 << 6));
    return 0;
  }